

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer ppVar4;
  bool bVar5;
  path *this;
  basic_ostream<char,_std::char_traits<char>_> *pbVar6;
  long lVar7;
  ostream *poVar8;
  reference pvVar9;
  long lVar10;
  int i;
  int iVar11;
  path *d;
  pointer __p;
  pointer pdVar12;
  int i_1;
  difference_type __d;
  ulong uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double local_570;
  double local_568;
  double local_560;
  vector<double,_std::allocator<double>_> v;
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> data_files
  ;
  string output_dir;
  string mkdir_command;
  vector<double,_std::allocator<double>_> v2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  istream_iterator<double,_char,_std::char_traits<char>,_long> local_490;
  __shared_ptr<std::filesystem::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
  local_478;
  __shared_ptr<std::filesystem::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
  local_468;
  istream_iterator<double,_char,_std::char_traits<char>,_long> local_458;
  ofstream output_file;
  ifstream f;
  
  data_files.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  data_files.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  data_files.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  output_dir._M_dataplus._M_p = getenv("HOME");
  std::filesystem::__cxx11::path::path<char*,std::filesystem::__cxx11::path>
            ((path *)&f,(char **)&output_dir,auto_format);
  std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
            ((recursive_directory_iterator *)&output_file,(path *)&f);
  std::filesystem::__cxx11::path::~path((path *)&f);
  std::
  __shared_ptr<std::filesystem::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_478,
                 (__shared_ptr<std::filesystem::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
                  *)&output_file);
  output_dir._M_dataplus._M_p = (pointer)local_478._M_ptr;
  output_dir._M_string_length = (size_type)local_478._M_refcount._M_pi;
  local_478._M_ptr = (element_type *)0x0;
  local_478._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)&local_478);
  std::
  __shared_ptr<std::filesystem::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_468,
                 (__shared_ptr<std::filesystem::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
                  *)&output_file);
  mkdir_command._M_dataplus._M_p = (pointer)0x0;
  mkdir_command._M_string_length = 0;
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)&local_468);
  while (output_dir._M_string_length != mkdir_command._M_string_length) {
    this = (path *)std::filesystem::__cxx11::recursive_directory_iterator::operator*
                             ((recursive_directory_iterator *)&output_dir);
    std::filesystem::__cxx11::path::string((string *)&f,this);
    bVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            ends_with((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
                      "_rse_workshop.dat");
    std::__cxx11::string::~string((string *)&f);
    if (bVar5) {
      std::vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>::
      emplace_back<std::filesystem::__cxx11::path_const&>
                ((vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>
                  *)&data_files,this);
    }
    std::filesystem::__cxx11::recursive_directory_iterator::operator++
              ((recursive_directory_iterator *)&output_dir);
  }
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)&mkdir_command);
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)&output_dir);
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)&output_file);
  std::
  __sort<__gnu_cxx::__normal_iterator<std::filesystem::__cxx11::path*,std::vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (data_files.
             super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
             ._M_impl.super__Vector_impl_data._M_start,
             data_files.
             super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  ppVar4 = data_files.
           super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__p = data_files.
             super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
             ._M_impl.super__Vector_impl_data._M_start; __p != ppVar4; __p = __p + 1) {
    pbVar6 = std::filesystem::__cxx11::operator<<
                       ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,__p);
    std::endl<char,std::char_traits<char>>((ostream *)pbVar6);
  }
  std::ifstream::ifstream<std::filesystem::__cxx11::path,std::filesystem::__cxx11::path>
            ((ifstream *)&f,
             data_files.
             super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
             ._M_impl.super__Vector_impl_data._M_start,_S_in);
  std::istream_iterator<double,_char,_std::char_traits<char>,_long>::istream_iterator
            (&local_490,(istream_type *)&f);
  local_458._M_stream = (istream_type *)0x0;
  local_458._M_value = 0.0;
  local_458._M_ok = false;
  std::vector<double,std::allocator<double>>::
  vector<std::istream_iterator<double,char,std::char_traits<char>,long>,void>
            ((vector<double,std::allocator<double>> *)&v,&local_490,&local_458,
             (allocator_type *)&output_file);
  dVar14 = std::
           reduce<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double,std::plus<void>>
                     (0,v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                      v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  lVar7 = (long)v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  auVar21._8_4_ =
       (int)((long)v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 0x23);
  auVar21._0_8_ = lVar7;
  auVar21._12_4_ = 0x45300000;
  dVar14 = dVar14 / ((auVar21._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0));
  dVar15 = std::
           transform_reduce<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double,std::plus<void>,std::multiplies<void>>
                     (0,v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                      v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish,
                      v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
  lVar7 = (long)v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  auVar22._8_4_ =
       (int)((long)v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 0x23);
  auVar22._0_8_ = lVar7;
  auVar22._12_4_ = 0x45300000;
  dVar15 = dVar15 / ((auVar22._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) -
           dVar14 * dVar14;
  if (dVar15 < 0.0) {
    dVar16 = sqrt(dVar15);
  }
  else {
    dVar16 = SQRT(dVar15);
  }
  std::operator<<((ostream *)&std::cout,"mean:   ");
  poVar8 = std::ostream::_M_insert<double>(dVar14);
  std::operator<<(poVar8,'\n');
  std::operator<<((ostream *)&std::cout,"var:    ");
  poVar8 = std::ostream::_M_insert<double>(dVar15);
  std::operator<<(poVar8,'\n');
  pdVar2 = v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  local_560 = 0.0;
  pdVar12 = v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start;
  for (lVar7 = (long)v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start; 0x18 < lVar7; lVar7 = lVar7 + -0x20) {
    dVar15 = pow((*pdVar12 - dVar14) / dVar16,3.0);
    dVar17 = pow((pdVar12[1] - dVar14) / dVar16,3.0);
    dVar18 = pow((pdVar12[2] - dVar14) / dVar16,3.0);
    dVar19 = pow((pdVar12[3] - dVar14) / dVar16,3.0);
    local_560 = local_560 + dVar19 + dVar18 + dVar17 + dVar15;
    pdVar12 = pdVar12 + 4;
  }
  for (; pdVar3 = v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish,
      pdVar1 = v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
               ._M_start, pdVar12 != pdVar2; pdVar12 = pdVar12 + 1) {
    dVar15 = pow((*pdVar12 - dVar14) / dVar16,3.0);
    local_560 = local_560 + dVar15;
  }
  std::operator<<((ostream *)&std::cout,"skew:   ");
  lVar7 = (long)pdVar3 - (long)pdVar1 >> 3;
  auVar20._8_4_ = (int)((long)pdVar3 - (long)pdVar1 >> 0x23);
  auVar20._0_8_ = lVar7;
  auVar20._12_4_ = 0x45300000;
  poVar8 = std::ostream::_M_insert<double>
                     (local_560 /
                      ((auVar20._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)));
  std::operator<<(poVar8,'\n');
  lVar7 = std::chrono::_V2::system_clock::now();
  std::vector<double,_std::allocator<double>_>::vector(&v2,&v);
  uVar13 = (ulong)((long)v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3) >> 1;
  std::nth_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                      (v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + uVar13),
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish);
  pvVar9 = std::vector<double,_std::allocator<double>_>::at(&v2,uVar13);
  dVar14 = *pvVar9;
  lVar10 = std::chrono::_V2::system_clock::now();
  *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) =
       *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
  std::operator<<((ostream *)&std::cout,"median took ");
  poVar8 = std::ostream::_M_insert<double>((double)(lVar10 - lVar7) / 1000000.0);
  std::operator<<(poVar8," ms\n");
  std::operator<<((ostream *)&std::cout,"median: ");
  poVar8 = std::ostream::_M_insert<double>(dVar14);
  std::operator<<(poVar8,'\n');
  for (lVar7 = 0;
      (long)v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start >> 3 != lVar7; lVar7 = lVar7 + 1) {
  }
  *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) =
       *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) | 1;
  poVar8 = std::operator<<((ostream *)&std::cout,"Any greater than 50? ");
  poVar8 = std::ostream::_M_insert<bool>(SUB81(poVar8,0));
  std::operator<<(poVar8,'\n');
  iVar11 = 0;
  lVar7 = 0;
  do {
    local_570 = dVar14;
    local_568 = dVar16 + dVar16;
    if (((long)v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
               ._M_finish -
         (long)v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
               ._M_start >> 3) + -1 == lVar7) goto LAB_00103a90;
    lVar10 = lVar7 + 1;
    local_568 = v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar7];
    local_570 = v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar7 + 1];
    lVar7 = lVar10;
  } while (ABS(local_570 - local_568) <= dVar16 + dVar16);
  iVar11 = (int)lVar10 + -1;
LAB_00103a90:
  poVar8 = std::operator<<((ostream *)&std::cout,"Position ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar11);
  std::operator<<(poVar8,", first ");
  poVar8 = std::ostream::_M_insert<double>(local_568);
  std::operator<<(poVar8," second: ");
  poVar8 = std::ostream::_M_insert<double>(local_570);
  std::operator<<(poVar8,'\n');
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&output_dir,"./output",(allocator<char> *)&output_file);
  std::operator+(&mkdir_command,"mkdir -p ",&output_dir);
  system(mkdir_command._M_dataplus._M_p);
  std::operator+(&local_4b0,&output_dir,"/results.dat");
  std::ofstream::ofstream(&output_file,(string *)&local_4b0,_S_out);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::ostream::_M_insert<double>
            (*v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start);
  for (uVar13 = 1;
      uVar13 < (ulong)((long)v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start >> 3); uVar13 = uVar13 + 1) {
    std::operator<<((ostream *)&output_file,',');
    std::ostream::_M_insert<double>
              (v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
               ._M_start[uVar13]);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&output_file);
  std::__cxx11::string::~string((string *)&mkdir_command);
  std::__cxx11::string::~string((string *)&output_dir);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&v2.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&v.super__Vector_base<double,_std::allocator<double>_>);
  std::ifstream::~ifstream(&f);
  std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
  ~vector(&data_files);
  return 0;
}

Assistant:

int main()
{
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 1. Reading some data in from a file
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    // Find all files like *_rse_workshop.dat under a specific directory
    std::vector<fs::path> data_files;
    for (auto &p : fs::recursive_directory_iterator(std::getenv("HOME")))
    {
        if (p.path().string().ends_with("_rse_workshop.dat"))
        {
            data_files.emplace_back(p.path());
        }
    }

    // This is just to make sure the same file is first, so the numbers later are the same on each version.
    // The sort isn't necessary!
    std::sort(data_files.begin(), data_files.end());

    // Which data files did we find? (range-for loop)
    for (const auto &d : data_files)
    {
        std::cout << d << std::endl;
    }


    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 2. Calculate the mean and standard deviation of some data
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    // Read some data in
    std::ifstream f(data_files[0]);
    std::vector<double> v{std::istream_iterator<double>(f), std::istream_iterator<double>()};

    const double mean = std::reduce(v.begin(), v.end(), 0.0) / v.size();
    const double var = std::transform_reduce(v.begin(), v.end(), v.begin(), 0.0) / v.size() - mean * mean;
    const double std = std::sqrt(var);

    std::cout << "mean:   " << mean << '\n';
    std::cout << "var:    " << var << '\n';


    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 3. Calculate the skewness - there's no default algorithm for that!
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    // Compute skewness
    auto third_moment = [mean, std](const double x) { return std::pow((x - mean) / std, 3); };
    const double skew = std::transform_reduce(v.begin(), v.end(), 0.0, std::plus<>(), third_moment) / v.size();

    std::cout << "skew:   " << skew << '\n';


    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 4. Calculate the median (and bonus chrono)
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    auto t1 = std::chrono::high_resolution_clock::now();

    // Take a copy of the vector so we can sort it
    std::vector<double> v2 = v;

    auto half_way = v2.size() / 2;
    std::nth_element(v2.begin(), std::next(v2.begin(), half_way), v2.end());
    const double median = v2.at(half_way);

    auto t2 = std::chrono::high_resolution_clock::now();
    std::chrono::duration<double, std::milli> ms = t2 - t1;
    std::cout << std::fixed << "median took " << ms.count() << " ms\n";

    std::cout << "median: " << median << '\n';


    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 5. What other algorithms are there?
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    // Are any of the elements > 50?
    bool any_greater_than_50 = false;

    for (int i = 0; i < v.size(); i++)
    {
        if (v[i] > 50.0)
        {
            any_greater_than_50 = true;
        }
    }
    std::cout << std::boolalpha << "Any greater than 50? " << any_greater_than_50 << '\n';

    // First position where consecutive elements differ by more than twice the standard deviation
    int dist = 0;
    double first, second;
    for (int i = 0; i < v.size() - 1; i++)
    {
        if (std::fabs(v[i + 1] - v[i]) > 2 * std)
        {
            dist = i;
            first = v[i];
            second = v[i + 1];
            break;
        }
    }
    std::cout << "Position " << dist << ", first " << first << " second: " << second << '\n';


    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 7. Writing some data back out to a csv file - pulling several concepts together
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    std::string output_dir = "./output";
    std::string mkdir_command = "mkdir -p " + output_dir;
    // System takes a const char* as a parameter
    system(mkdir_command.c_str());

    // Create an output file
    std::ofstream output_file(output_dir + "/results.dat");
    output_file << v[0];
    for (int i = 1; i < v.size(); i++)
    {
        output_file << ',' << v[i];
    }
    output_file.close();
}